

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,ByteData *parent_fingerprint,Pubkey *pubkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num,Bip32FormatType format_type)

{
  uint8_t depth_00;
  ByteData256 *chain_code_00;
  ByteData256 *pubkey_00;
  Pubkey *parent_fingerprint_00;
  uint32_t version;
  Extkey *this_00;
  undefined1 local_e0 [175];
  uint8_t local_31;
  ByteData256 *pBStack_30;
  uint8_t depth_local;
  ByteData256 *chain_code_local;
  Pubkey *pubkey_local;
  ByteData *parent_fingerprint_local;
  ExtPubkey *pEStack_10;
  NetType network_type_local;
  ExtPubkey *this_local;
  
  local_31 = depth;
  pBStack_30 = chain_code;
  chain_code_local = (ByteData256 *)pubkey;
  pubkey_local = (Pubkey *)parent_fingerprint;
  parent_fingerprint_local._4_4_ = network_type;
  pEStack_10 = this;
  version = ConvertToExtkeyVersion(network_type,format_type,false);
  parent_fingerprint_00 = pubkey_local;
  pubkey_00 = chain_code_local;
  chain_code_00 = pBStack_30;
  depth_00 = local_31;
  this_00 = (Extkey *)local_e0;
  ByteData256::ByteData256((ByteData256 *)this_00);
  Extkey::FromPubkey((Extkey *)(local_e0 + 0x18),version,&parent_fingerprint_00->data_,
                     (Pubkey *)pubkey_00,chain_code_00,depth_00,child_num,(ByteData256 *)this_00);
  Extkey::Extkey(&this->super_Extkey,(Extkey *)(local_e0 + 0x18));
  Extkey::~Extkey(this_00);
  ByteData256::~ByteData256((ByteData256 *)0x465b14);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const ByteData& parent_fingerprint,
    const Pubkey& pubkey, const ByteData256& chain_code, uint8_t depth,
    uint32_t child_num, Bip32FormatType format_type)
    : Extkey(Extkey::FromPubkey(
          ConvertToExtkeyVersion(network_type, format_type, false),
          parent_fingerprint, pubkey, chain_code, depth, child_num)) {}